

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-lite-sec-utils.c
# Opt level: O1

int encodeSignatureBits(uint8_t *sig)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  uint8_t *puVar7;
  size_t __n;
  
  iVar6 = 0x21;
  iVar4 = 0x21;
  if (-1 < (char)sig[8]) {
    iVar4 = 0x20;
    lVar5 = 0;
    do {
      if ((sig[lVar5 + 9] & 0x80) != 0 || sig[lVar5 + 8] != '\0') goto LAB_00116115;
      lVar5 = lVar5 + 1;
      iVar4 = iVar4 + -1;
    } while (lVar5 != 0x1f);
    iVar4 = 1;
  }
LAB_00116115:
  if (-1 < (char)sig[0x28]) {
    iVar6 = 0x20;
    lVar5 = 0;
    do {
      if ((sig[lVar5 + 0x29] & 0x80) != 0 || sig[lVar5 + 0x28] != '\0') goto LAB_0011614a;
      lVar5 = lVar5 + 1;
      iVar6 = iVar6 + -1;
    } while (lVar5 != 0x1f);
    iVar6 = 1;
  }
LAB_0011614a:
  *sig = '0';
  sig[1] = (uint8_t)iVar4 + (uint8_t)iVar6 + '\x04';
  sig[2] = '\x02';
  sig[3] = (uint8_t)iVar4;
  if (iVar4 == 0x21) {
    sig[4] = '\0';
    *(undefined8 *)(sig + 0x15) = *(undefined8 *)(sig + 0x18);
    *(undefined8 *)(sig + 0x1d) = *(undefined8 *)(sig + 0x20);
    *(undefined8 *)(sig + 5) = *(undefined8 *)(sig + 8);
    *(undefined8 *)(sig + 0xd) = *(undefined8 *)(sig + 0x10);
    puVar7 = sig + 0x25;
  }
  else {
    __n = (size_t)iVar4;
    memmove(sig + 4,sig + (0x28 - __n),__n);
    puVar7 = sig + 4 + __n;
  }
  *puVar7 = '\x02';
  puVar7[1] = (uint8_t)iVar6;
  if (iVar6 == 0x21) {
    puVar7[2] = '\0';
    uVar1 = *(undefined8 *)(sig + 0x28);
    uVar2 = *(undefined8 *)(sig + 0x30);
    uVar3 = *(undefined8 *)(sig + 0x40);
    *(undefined8 *)(puVar7 + 0x13) = *(undefined8 *)(sig + 0x38);
    *(undefined8 *)(puVar7 + 0x1b) = uVar3;
    *(undefined8 *)(puVar7 + 3) = uVar1;
    *(undefined8 *)(puVar7 + 0xb) = uVar2;
    iVar6 = (int)puVar7 + 0x23;
  }
  else {
    memmove(puVar7 + 2,sig + (0x48 - (long)iVar6),(long)iVar6);
    iVar6 = (int)(puVar7 + 2) + iVar6;
  }
  return iVar6 - (int)sig;
}

Assistant:

static int
encodeSignatureBits(uint8_t* sig)
{
  const uint8_t* begin = sig;
  const uint8_t* r = sig + 8;
  const uint8_t* s = r + 32;
  int rLength = determineAsn1IntLength(r);
  int sLength = determineAsn1IntLength(s);

  *(sig++) = ASN1_SEQUENCE;
  *(sig++) = 2 + rLength + 2 + sLength;
  sig = writeAsn1Int(sig, r, rLength);
  sig = writeAsn1Int(sig, s, sLength);

  return sig - begin;
}